

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extdev.c
# Opt level: O1

int envy_bios_parse_extdev(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  envy_bios_extdev_entry *peVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  char *__format;
  ulong uVar12;
  bool bVar13;
  uint8_t bytes [4];
  undefined8 uStack_38;
  
  uVar3 = (bios->extdev).offset;
  iVar4 = 0;
  if (uVar3 != 0) {
    uStack_38 = 0;
    if ((uint)uVar3 < bios->length) {
      (bios->extdev).version = bios->data[(uint)uVar3];
      uVar8 = 0;
    }
    else {
      (bios->extdev).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar8 = 0xfffffff2;
    }
    lVar9 = (ulong)(bios->extdev).offset + 1;
    if ((uint)lVar9 < bios->length) {
      (bios->extdev).hlen = bios->data[lVar9];
      uVar6 = 0;
    }
    else {
      (bios->extdev).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar6 = 0xfffffff2;
    }
    lVar9 = (ulong)(bios->extdev).offset + 2;
    if ((uint)lVar9 < bios->length) {
      (bios->extdev).entriesnum = bios->data[lVar9];
      uVar5 = 0;
    }
    else {
      (bios->extdev).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar5 = 0xfffffff2;
    }
    lVar9 = (ulong)(bios->extdev).offset + 3;
    if ((uint)lVar9 < bios->length) {
      (bios->extdev).rlen = bios->data[lVar9];
      uVar11 = 0;
    }
    else {
      (bios->extdev).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar11 = 0xfffffff2;
    }
    uVar11 = uVar6 | uVar8 | uVar5 | uVar11;
    if (4 < (bios->extdev).hlen) {
      lVar9 = (ulong)(bios->extdev).offset + 4;
      if ((uint)lVar9 < bios->length) {
        (bios->extdev).unk04 = bios->data[lVar9];
        uVar8 = 0;
      }
      else {
        (bios->extdev).unk04 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar8 = 0xfffffff2;
      }
      uVar11 = uVar11 | uVar8;
    }
    if (uVar11 == 0) {
      envy_bios_block(bios,(uint)(bios->extdev).offset,
                      (uint)(bios->extdev).entriesnum * (uint)(bios->extdev).rlen +
                      (uint)(bios->extdev).hlen,"EXTDEV",-1);
      uVar1 = (bios->extdev).version;
      if ((uVar1 == '0') || (uVar1 == '@')) {
        bVar2 = (bios->extdev).hlen;
        uVar10 = (ulong)bVar2;
        uVar8 = 5 - (bVar2 < 5);
        uVar12 = (ulong)uVar8;
        if (uVar8 < bVar2 || uVar8 == bVar2) {
          uVar6 = (uint)(bios->extdev).rlen;
          if (3 < uVar6) {
            if (uVar8 < bVar2) {
              fprintf(_stderr,"EXTDEV table header longer than expected [%d > %d]\n");
            }
            bVar2 = (bios->extdev).rlen;
            if (4 < bVar2) {
              fprintf(_stderr,"EXTDEV table record longer than expected [%d > %d]\n",(ulong)bVar2,4)
              ;
            }
            peVar7 = (envy_bios_extdev_entry *)calloc((ulong)(bios->extdev).entriesnum,8);
            (bios->extdev).entries = peVar7;
            if (peVar7 == (envy_bios_extdev_entry *)0x0) {
              return -0xc;
            }
            if ((bios->extdev).entriesnum != '\0') {
              uVar12 = 0;
              uVar8 = 0;
              do {
                peVar7 = (bios->extdev).entries;
                peVar7[uVar12].offset =
                     (ushort)(bios->extdev).rlen * (short)uVar12 +
                     (ushort)(bios->extdev).hlen + (bios->extdev).offset;
                uVar10 = 0;
                bVar13 = false;
                do {
                  if ((int)uVar10 + (uint)peVar7[uVar12].offset < bios->length) {
                    *(uint8_t *)((long)&uStack_38 + uVar10 + 4) =
                         bios->data[uVar10 + peVar7[uVar12].offset];
                    uVar6 = 0;
                  }
                  else {
                    *(undefined1 *)((long)&uStack_38 + uVar10 + 4) = 0;
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                    uVar6 = 0xfffffff2;
                  }
                  uVar8 = uVar6 | uVar8;
                  if (uVar8 != 0) goto LAB_0025a51b;
                  bVar13 = 2 < uVar10;
                  uVar10 = uVar10 + 1;
                  uVar8 = 0;
                } while (uVar10 != 4);
                peVar7[uVar12].type = uStack_38._4_1_;
                peVar7[uVar12].addr = uStack_38._5_1_;
                peVar7[uVar12].bus = uStack_38._6_1_ >> 4 & 1;
                peVar7[uVar12].unk02_0 = uStack_38._6_1_ & 0xf;
                peVar7[uVar12].unk02_5 = uStack_38._6_1_ >> 5;
                peVar7[uVar12].unk03 = uStack_38._7_1_;
                uVar8 = 0;
LAB_0025a51b:
                if (!bVar13) goto LAB_0025a36a;
                uVar12 = uVar12 + 1;
              } while (uVar12 < (bios->extdev).entriesnum);
            }
            (bios->extdev).valid = '\x01';
            return 0;
          }
          __format = "EXTDEV table record too short [%d < %d]\n";
          uVar10 = (ulong)uVar6;
          uVar12 = 4;
        }
        else {
          __format = "EXTDEV table header too short [%d < %d]\n";
        }
        fprintf(_stderr,__format,uVar10,uVar12);
      }
      else {
        envy_bios_parse_extdev_cold_1();
      }
      iVar4 = -0x16;
    }
    else {
LAB_0025a36a:
      iVar4 = -0xe;
    }
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_extdev (struct envy_bios *bios) {
	struct envy_bios_extdev *extdev = &bios->extdev;
	if (!extdev->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, extdev->offset, &extdev->version);
	err |= bios_u8(bios, extdev->offset+1, &extdev->hlen);
	err |= bios_u8(bios, extdev->offset+2, &extdev->entriesnum);
	err |= bios_u8(bios, extdev->offset+3, &extdev->rlen);
	if (extdev->hlen >= 5)
		err |= bios_u8(bios, extdev->offset+4, &extdev->unk04);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, extdev->offset, extdev->hlen + extdev->rlen * extdev->entriesnum, "EXTDEV", -1);
	int wanthlen = 4;
	int wantrlen = 4;
	switch (extdev->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown EXTDEV table version %d.%d\n", extdev->version >> 4, extdev->version & 0xf);
			return -EINVAL;
	}
	if (extdev->hlen >= 5)
		wanthlen = 5;
	if (extdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("EXTDEV table header too short [%d < %d]\n", extdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (extdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("EXTDEV table record too short [%d < %d]\n", extdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (extdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("EXTDEV table header longer than expected [%d > %d]\n", extdev->hlen, wanthlen);
	}
	if (extdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("EXTDEV table record longer than expected [%d > %d]\n", extdev->rlen, wantrlen);
	}
	extdev->entries = calloc(extdev->entriesnum, sizeof *extdev->entries);
	if (!extdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < extdev->entriesnum; i++) {
		struct envy_bios_extdev_entry *entry = &extdev->entries[i];
		entry->offset = extdev->offset + extdev->hlen + extdev->rlen * i;
		uint8_t bytes[4];
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		entry->type = bytes[0];
		entry->addr = bytes[1];
		entry->bus = bytes[2] >> 4 & 1;
		entry->unk02_0 = bytes[2] & 0xf;
		entry->unk02_5 = bytes[2] >> 5;
		entry->unk03 = bytes[3];
	}
	extdev->valid = 1;
	return 0;
}